

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear_glfw_gl2.h
# Opt level: O3

void nk_glfw3_shutdown(void)

{
  nk_font_atlas_clear(&glfw.atlas);
  nk_free(&glfw.ctx);
  (*glad_glDeleteTextures)(1,&glfw.ogl.font_tex);
  if (((glfw.ogl.cmds.memory.ptr != (void *)0x0) && (glfw.ogl.cmds.type != NK_BUFFER_FIXED)) &&
     (glfw.ogl.cmds.pool.free != (nk_plugin_free)0x0)) {
    (*glfw.ogl.cmds.pool.free)(glfw.ogl.cmds.pool.userdata,glfw.ogl.cmds.memory.ptr);
  }
  memset(&glfw,0,0x4758);
  return;
}

Assistant:

NK_API
void nk_glfw3_shutdown(void)
{
    struct nk_glfw_device *dev = &glfw.ogl;
    nk_font_atlas_clear(&glfw.atlas);
    nk_free(&glfw.ctx);
    glDeleteTextures(1, &dev->font_tex);
    nk_buffer_free(&dev->cmds);
    NK_MEMSET(&glfw, 0, sizeof(glfw));
}